

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

bool __thiscall BacktraceData::Add(BacktraceData *this,cmListFileBacktrace *bt,ArrayIndex *index)

{
  bool bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  iterator iVar4;
  Value *pVVar5;
  mapped_type *pmVar6;
  cmListFileContext *top;
  ArrayIndex parent;
  Value entry;
  cmListFileContext *local_118;
  UInt local_10c;
  cmListFileBacktrace local_108;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  bVar1 = cmListFileBacktrace::Empty(bt);
  if (!bVar1) {
    local_118 = cmListFileBacktrace::Top(bt);
    iVar4 = std::
            _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->NodeMap)._M_h,&local_118);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      Json::Value::Value(&local_f8,objectValue);
      AVar3 = AddFile(this,&local_118->FilePath);
      Json::Value::Value(&local_58,AVar3);
      pVVar5 = Json::Value::operator[](&local_f8,"file");
      Json::Value::operator=(pVVar5,&local_58);
      Json::Value::~Value(&local_58);
      if (local_118->Line != 0) {
        Json::Value::Value(&local_80,(Int)local_118->Line);
        pVVar5 = Json::Value::operator[](&local_f8,"line");
        Json::Value::operator=(pVVar5,&local_80);
        Json::Value::~Value(&local_80);
      }
      if ((local_118->Name)._M_string_length != 0) {
        AVar3 = AddCommand(this,&local_118->Name);
        Json::Value::Value(&local_a8,AVar3);
        pVVar5 = Json::Value::operator[](&local_f8,"command");
        Json::Value::operator=(pVVar5,&local_a8);
        Json::Value::~Value(&local_a8);
      }
      cmListFileBacktrace::Pop(&local_108);
      bVar2 = Add(this,&local_108,&local_10c);
      if (local_108.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (bVar2) {
        Json::Value::Value(&local_d0,local_10c);
        pVVar5 = Json::Value::operator[](&local_f8,"parent");
        Json::Value::operator=(pVVar5,&local_d0);
        Json::Value::~Value(&local_d0);
      }
      AVar3 = Json::Value::size(&this->Nodes);
      pmVar6 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->NodeMap,&local_118);
      *pmVar6 = AVar3;
      *index = AVar3;
      Json::Value::append(&this->Nodes,&local_f8);
      Json::Value::~Value(&local_f8);
    }
    else {
      *index = *(ArrayIndex *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                       ._M_cur + 0x10);
    }
  }
  return !bVar1;
}

Assistant:

bool BacktraceData::Add(cmListFileBacktrace const& bt, Json::ArrayIndex& index)
{
  if (bt.Empty()) {
    return false;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index = found->second;
    return true;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  Json::ArrayIndex parent;
  if (this->Add(bt.Pop(), parent)) {
    entry["parent"] = parent;
  }
  index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return true;
}